

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge)

{
  double dVar1;
  TEdge *pTVar2;
  long lVar3;
  bool bVar4;
  TEdge *pTVar5;
  TEdge **ppTVar6;
  
  edge->nextInAEL = (TEdge *)0x0;
  edge->prevInAEL = (TEdge *)0x0;
  pTVar2 = this->m_ActiveEdges;
  ppTVar6 = &this->m_ActiveEdges;
  if (pTVar2 != (TEdge *)0x0) {
    dVar1 = edge->dx;
    lVar3 = edge->xcurr;
    bVar4 = lVar3 < pTVar2->xcurr;
    if (lVar3 == pTVar2->xcurr) {
      bVar4 = pTVar2->dx <= dVar1 && dVar1 != pTVar2->dx;
    }
    if (bVar4) {
      edge->nextInAEL = pTVar2;
      (*ppTVar6)->prevInAEL = edge;
    }
    else {
      do {
        pTVar5 = pTVar2;
        pTVar2 = pTVar5->nextInAEL;
        if (pTVar2 == (TEdge *)0x0) break;
        bVar4 = lVar3 < pTVar2->xcurr;
        if (lVar3 == pTVar2->xcurr) {
          bVar4 = pTVar2->dx <= dVar1 && dVar1 != pTVar2->dx;
        }
      } while (!bVar4);
      edge->nextInAEL = pTVar2;
      if (pTVar5->nextInAEL != (TEdge *)0x0) {
        pTVar5->nextInAEL->prevInAEL = edge;
      }
      edge->prevInAEL = pTVar5;
      ppTVar6 = &pTVar5->nextInAEL;
    }
  }
  *ppTVar6 = edge;
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge)
{
  edge->prevInAEL = 0;
  edge->nextInAEL = 0;
  if( !m_ActiveEdges )
  {
    m_ActiveEdges = edge;
  }
  else if( E2InsertsBeforeE1(*m_ActiveEdges, *edge) )
  {
    edge->nextInAEL = m_ActiveEdges;
    m_ActiveEdges->prevInAEL = edge;
    m_ActiveEdges = edge;
  } else
  {
    TEdge* e = m_ActiveEdges;
    while( e->nextInAEL  && !E2InsertsBeforeE1(*e->nextInAEL , *edge) )
      e = e->nextInAEL;
    edge->nextInAEL = e->nextInAEL;
    if( e->nextInAEL ) e->nextInAEL->prevInAEL = edge;
    edge->prevInAEL = e;
    e->nextInAEL = edge;
  }
}